

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

bool __thiscall
libcellml::Validator::ValidatorImpl::checkIssuesForDuplications
          (ValidatorImpl *this,string *description)

{
  _Alloc_hider _Var1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  Logger local_60;
  string local_50;
  
  sVar3 = Logger::issueCount(&this->mValidator->super_Logger);
  if (sVar3 == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
    uVar5 = 1;
    sVar4 = sVar3;
    do {
      sVar4 = sVar4 - 1;
      Logger::issue(&local_60,(size_t)this->mValidator);
      Issue::description_abi_cxx11_(&local_50,(Issue *)local_60._vptr_Logger);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == description->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,(description->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar7 = iVar2 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_60.mPimpl != (LoggerImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.mPimpl);
      }
      if (bVar7) {
        return bVar6;
      }
      bVar6 = uVar5 < sVar3;
      uVar5 = uVar5 + 1;
    } while (sVar4 != 0);
  }
  return bVar6;
}

Assistant:

bool Validator::ValidatorImpl::checkIssuesForDuplications(const std::string &description) const
{
    size_t count = mValidator->issueCount();
    for (size_t i = 0; i < count; ++i) {
        if (mValidator->issue(count - 1 - i)->description() == description) {
            return true;
        }
    }
    return false;
}